

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floatingpoint_tests.cpp
# Opt level: O2

void __thiscall
floatingpoint_test::iu_FloatingpointTest_x_iutest_x_NINF_Test<float>::Body
          (iu_FloatingpointTest_x_iutest_x_NINF_Test<float> *this)

{
  floating_point<float> *in_R9;
  _Myt f;
  AssertionResult iutest_ar;
  float local_190 [98];
  
  local_190[0] = -FloatingpointTest<float>::ONE / FloatingpointTest<float>::ZERO;
  f.m_v = (FInt)0xff800000;
  iutest::internal::CmpHelperEQ<iutest::floating_point<float>,iutest::floating_point<float>>
            (&iutest_ar,(internal *)"FloatType(a/b)","FloatType::NINF()",(char *)local_190,&f,in_R9)
  ;
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)&f,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/floatingpoint_tests.cpp"
               ,0x50,iutest_ar.m_message._M_dataplus._M_p);
    iutest::AssertionHelper::operator=((AssertionHelper *)&f,(Fixed *)local_190);
    std::__cxx11::string::~string((string *)&f);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
  }
  std::__cxx11::string::~string((string *)&iutest_ar);
  return;
}

Assistant:

IUTEST_TYPED_TEST(FloatingpointTest, NINF)
{
    typedef typename TestFixture::ftype FloatType;
    TypeParam a= - TestFixture::ONE;
    TypeParam b=TestFixture::ZERO;
    IUTEST_EXPECT_EQ(FloatType(a/b), FloatType::NINF());
}